

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O1

int UpnpSetMaxSubscriptionTimeOut(UpnpDevice_Handle Hnd,int MaxSubscriptionTimeOut)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  Handle_Info **HndInfo;
  char *file;
  Handle_Info *SInfo;
  Handle_Info *local_20;
  
  local_20 = (Handle_Info *)0x0;
  iVar2 = -0x74;
  if (UpnpSdkInit == 1) {
    iVar2 = 6;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x86e,"Inside UpnpSetMaxSubscriptionTimeOut\n"
              );
    HandleLock((char *)0x871,iVar2);
    HndInfo = &local_20;
    UVar1 = GetHandleInfo(Hnd,HndInfo);
    if (UVar1 == HND_DEVICE) {
      if (-2 < MaxSubscriptionTimeOut) {
        local_20->MaxSubscriptionTimeOut = MaxSubscriptionTimeOut;
        HandleUnlock((char *)0x881,(int)HndInfo);
        UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x886,
                   "Exiting UpnpSetMaxSubscriptionTimeOut\n");
        return 0;
      }
      file = (char *)0x87c;
    }
    else {
      file = (char *)0x877;
    }
    HandleUnlock(file,(int)HndInfo);
    iVar2 = -100;
  }
  return iVar2;
}

Assistant:

int UpnpSetMaxSubscriptionTimeOut(
	UpnpDevice_Handle Hnd, int MaxSubscriptionTimeOut)
{
	struct Handle_Info *SInfo = NULL;

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpSetMaxSubscriptionTimeOut\n");

	HandleLock(__FILE__, __LINE__);

	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_DEVICE:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	if ((MaxSubscriptionTimeOut != UPNP_INFINITE) &&
		(MaxSubscriptionTimeOut < 0)) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}

	SInfo->MaxSubscriptionTimeOut = MaxSubscriptionTimeOut;
	HandleUnlock(__FILE__, __LINE__);

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpSetMaxSubscriptionTimeOut\n");

	return UPNP_E_SUCCESS;
}